

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O1

uint32 __thiscall crnlib::random::urand32(random *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32 uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  
  iVar1 = (this->m_kiss99).x * 0x10dcd;
  (this->m_kiss99).x = iVar1 + 0x3039;
  uVar5 = (this->m_kiss99).y;
  uVar5 = uVar5 << 0xd ^ uVar5;
  uVar5 = uVar5 >> 0x11 ^ uVar5;
  uVar5 = uVar5 << 5 ^ uVar5;
  (this->m_kiss99).y = uVar5;
  lVar8 = (ulong)(this->m_kiss99).z * 0x29a65ead + (ulong)(this->m_kiss99).c;
  *(long *)&(this->m_kiss99).z = lVar8;
  uVar4 = (this->m_ranctx).b;
  uVar3 = (this->m_ranctx).c;
  uVar6 = (uVar3 << 0x11 | uVar3 >> 0xf) ^ uVar4;
  iVar2 = (this->m_ranctx).a - (uVar4 << 0x1b | uVar4 >> 5);
  (this->m_ranctx).a = uVar6;
  uVar7 = (this->m_ranctx).d;
  (this->m_ranctx).b = uVar3 + uVar7;
  (this->m_ranctx).c = uVar7 + iVar2;
  uVar7 = uVar6 + iVar2;
  (this->m_ranctx).d = uVar7;
  uVar4 = (this->m_well512).m_index;
  uVar3 = (this->m_well512).m_state[uVar4];
  uVar6 = (this->m_well512).m_state[uVar4 + 0xd & 0xf];
  uVar9 = uVar3 << 0x10 ^ uVar3 ^ uVar6;
  uVar3 = (this->m_well512).m_state[uVar4 + 9 & 0xf];
  uVar3 = uVar3 >> 0xb ^ uVar3;
  uVar10 = uVar6 << 0xf ^ uVar9 ^ uVar3;
  (this->m_well512).m_state[uVar4] = uVar10;
  uVar6 = (this->m_well512).m_index - 1 & 0xf;
  (this->m_well512).m_index = uVar6;
  uVar4 = (this->m_well512).m_state[uVar6];
  uVar4 = uVar3 ^ uVar4 ^ uVar3 << 0x1c ^ uVar9 << 0x12 ^ uVar4 * 4 ^ (uVar10 & 0x6d22169) << 5;
  (this->m_well512).m_state[uVar6] = uVar4;
  return uVar4 + uVar7 ^ uVar5 + iVar1 + 0x3039 + (int)lVar8;
}

Assistant:

inline uint32 kiss99::next() {
  x = 69069 * x + 12345;

  y ^= (y << 13);
  y ^= (y >> 17);
  y ^= (y << 5);

  uint64 t = c;
  t += (698769069ULL * z);
  c = static_cast<uint32>(t >> 32);
  z = static_cast<uint32>(t);

  return (x + y + z);
}